

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::StencilCase::executeOps
          (StencilCase *this,Context *context,IVec4 *cell,
          vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
          *ops)

{
  Type TVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined4 uVar14;
  StencilOp *op;
  pointer pSVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  Vec3 local_88;
  undefined4 uStack_7c;
  StencilCase *local_70;
  Vec3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar3 = cell->m_data[0];
  iVar4 = cell->m_data[2];
  iVar5 = cell->m_data[3];
  iVar8 = (*context->_vptr_Context[2])(context);
  local_58 = ZEXT416((uint)cell->m_data[1]);
  iVar9 = (*context->_vptr_Context[3])(context);
  iVar6 = cell->m_data[2];
  iVar7 = cell->m_data[3];
  iVar10 = (*context->_vptr_Context[2])(context);
  local_48 = ZEXT416((uint)cell->m_data[3]);
  iVar11 = (*context->_vptr_Context[3])(context);
  uVar12 = this->m_shaderID;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_88.m_data[2] = 0.0;
  uStack_7c = 0x3f800000;
  local_70 = this;
  (*context->_vptr_Context[0x76])(context,(ulong)uVar12);
  uVar12 = (*context->_vptr_Context[0x66])(context,(ulong)uVar12,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar12,1,&local_88);
  pSVar15 = (ops->
            super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pSVar15 !=
      (ops->
      super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    auVar18._0_4_ = (float)iVar3;
    auVar18._4_4_ = (float)(int)local_58._0_4_;
    auVar18._8_4_ = (float)iVar4;
    auVar18._12_4_ = (float)iVar5;
    auVar19._4_4_ = (float)iVar9;
    auVar19._0_4_ = (float)iVar8;
    auVar19._8_8_ = 0;
    auVar19 = divps(auVar18,auVar19);
    fVar17 = auVar19._0_4_ + auVar19._0_4_ + -1.0;
    fVar20 = auVar19._4_4_ + auVar19._4_4_ + -1.0;
    auVar21._0_4_ = (float)iVar6;
    auVar21._4_4_ = (float)(int)local_48._0_4_;
    auVar21._8_4_ = (float)iVar6;
    auVar21._12_4_ = (float)iVar7;
    auVar2._4_4_ = (float)iVar11;
    auVar2._0_4_ = (float)iVar10;
    auVar2._8_8_ = 0;
    auVar19 = divps(auVar21,auVar2);
    do {
      TVar1 = pSVar15->type;
      if (TVar1 == TYPE_CLEAR_STENCIL) {
        (*context->_vptr_Context[0x33])(context,0xc11);
        (*context->_vptr_Context[0x32])
                  (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                   (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
        (*context->_vptr_Context[0x2c])(context,(ulong)(uint)pSVar15->stencil);
        uVar14 = 0x400;
LAB_00f351c4:
        uVar16 = 0xc11;
        lVar13 = 0x168;
LAB_00f351c9:
        (**(code **)((long)context->_vptr_Context + lVar13))(context,uVar14);
        (*context->_vptr_Context[0x34])(context,uVar16);
      }
      else {
        if (TVar1 == TYPE_QUAD) {
          uVar16 = 0xb71;
          (*context->_vptr_Context[0x33])(context,0xb71);
          uVar14 = 0xb90;
          (*context->_vptr_Context[0x33])(context,0xb90);
          (*context->_vptr_Context[0x39])(context,(ulong)pSVar15->depthTest);
          (*context->_vptr_Context[0x35])
                    (context,(ulong)pSVar15->stencilTest,(ulong)(uint)pSVar15->stencil,
                     (ulong)pSVar15->stencilMask);
          (*context->_vptr_Context[0x36])
                    (context,(ulong)pSVar15->sFail,(ulong)pSVar15->dFail,(ulong)pSVar15->dPass);
          local_88.m_data[2] = pSVar15->depth;
          local_88.m_data[1] = fVar20;
          local_88.m_data[0] = fVar17;
          local_68.m_data[1] = auVar19._4_4_ + auVar19._4_4_ + fVar20;
          local_68.m_data[0] = auVar19._0_4_ + auVar19._0_4_ + fVar17;
          local_68.m_data[2] = local_88.m_data[2];
          sglr::drawQuad(context,local_70->m_shaderID,&local_88,&local_68);
          lVar13 = 0x1a0;
          goto LAB_00f351c9;
        }
        if (TVar1 == TYPE_CLEAR_DEPTH) {
          (*context->_vptr_Context[0x33])(context,0xc11);
          (*context->_vptr_Context[0x32])
                    (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                     (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
          (*context->_vptr_Context[0x2b])(pSVar15->depth,context);
          uVar14 = 0x100;
          goto LAB_00f351c4;
        }
      }
      pSVar15 = pSVar15 + 1;
    } while (pSVar15 !=
             (ops->
             super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StencilCase::executeOps (sglr::Context& context, const IVec4& cell, const vector<StencilOp>& ops)
{
	// For quadOps
	float x0 = 2.0f*((float)cell.x() / (float)context.getWidth())-1.0f;
	float y0 = 2.0f*((float)cell.y() / (float)context.getHeight())-1.0f;
	float x1 = x0 + 2.0f*((float)cell.z() / (float)context.getWidth());
	float y1 = y0 + 2.0f*((float)cell.w() / (float)context.getHeight());

	m_shader.setColor(context, m_shaderID, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (vector<StencilOp>::const_iterator i = ops.begin(); i != ops.end(); i++)
	{
		const StencilOp& op = *i;

		switch (op.type)
		{
			case StencilOp::TYPE_CLEAR_DEPTH:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearDepthf(op.depth);
				context.clear(GL_DEPTH_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_CLEAR_STENCIL:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearStencil(op.stencil);
				context.clear(GL_STENCIL_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_QUAD:
				context.enable(GL_DEPTH_TEST);
				context.enable(GL_STENCIL_TEST);
				context.depthFunc(op.depthTest);
				context.stencilFunc(op.stencilTest, op.stencil, op.stencilMask);
				context.stencilOp(op.sFail, op.dFail, op.dPass);
				sglr::drawQuad(context, m_shaderID, Vec3(x0, y0, op.depth), Vec3(x1, y1, op.depth));
				context.disable(GL_STENCIL_TEST);
				context.disable(GL_DEPTH_TEST);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}